

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_gcn_shader_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t op0;
  char *op;
  string expr;
  uint32_t local_4c;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_4c = eop;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_AMD_gcn_shader","");
  require_extension_internal(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_4c == 1) {
    op0 = *args;
    op = "cubeFaceIndexAMD";
  }
  else {
    if (local_4c != 2) {
      if (local_4c != 3) {
        statement<char_const(&)[40],unsigned_int&>
                  (this,(char (*) [40])"// unimplemented SPV AMD gcn shader op ",&local_4c);
        return;
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"timeAMD()","");
      emit_op(this,result_type,id,&local_48,true,false);
      register_control_dependent_expression(this,id);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == paVar1) {
        return;
      }
      operator_delete(local_48._M_dataplus._M_p);
      return;
    }
    op0 = *args;
    op = "cubeFaceCoordAMD";
  }
  emit_unary_func_op(this,result_type,id,op0,op);
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_gcn_shader_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args,
                                              uint32_t)
{
	require_extension_internal("GL_AMD_gcn_shader");

	enum AMDGCNShader
	{
		CubeFaceIndexAMD = 1,
		CubeFaceCoordAMD = 2,
		TimeAMD = 3
	};

	auto op = static_cast<AMDGCNShader>(eop);

	switch (op)
	{
	case CubeFaceIndexAMD:
		emit_unary_func_op(result_type, id, args[0], "cubeFaceIndexAMD");
		break;
	case CubeFaceCoordAMD:
		emit_unary_func_op(result_type, id, args[0], "cubeFaceCoordAMD");
		break;
	case TimeAMD:
	{
		string expr = "timeAMD()";
		emit_op(result_type, id, expr, true);
		register_control_dependent_expression(id);
		break;
	}

	default:
		statement("// unimplemented SPV AMD gcn shader op ", eop);
		break;
	}
}